

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

void ly_ctx_unset_searchdirs(ly_ctx *ctx)

{
  char **__ptr;
  char *__ptr_00;
  long lVar1;
  
  if ((ctx->models).search_paths != (char **)0x0) {
    __ptr = (ctx->models).search_paths;
    __ptr_00 = *__ptr;
    if (__ptr_00 != (char *)0x0) {
      lVar1 = 8;
      do {
        free(__ptr_00);
        __ptr = (ctx->models).search_paths;
        __ptr_00 = *(char **)((long)__ptr + lVar1);
        lVar1 = lVar1 + 8;
      } while (__ptr_00 != (char *)0x0);
    }
    free(__ptr);
    (ctx->models).search_paths = (char **)0x0;
  }
  return;
}

Assistant:

API void
ly_ctx_unset_searchdirs(struct ly_ctx *ctx)
{
    int i;

    if (!ctx->models.search_paths) {
        return;
    }

    for (i = 0; ctx->models.search_paths[i]; i++) {
        free(ctx->models.search_paths[i]);
    }
    free(ctx->models.search_paths);
    ctx->models.search_paths = NULL;
}